

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerCallIDynamicSpread(Lowerer *this,Instr *callInstr,ushort callFlags)

{
  Func *this_00;
  Instr *this_01;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  RejitException *this_02;
  Opnd *pOVar5;
  SymOpnd *pSVar6;
  StackSym *pSVar7;
  RegOpnd *pRVar8;
  RegOpnd *pRVar9;
  Instr *insertBeforeInstrForCFG_00;
  IndirOpnd *pIVar10;
  LabelInstr *target;
  IntConstOpnd *pIVar11;
  RegOpnd *indexOpnd_00;
  Instr *pIVar12;
  RegOpnd *arrayElementsStartOpnd;
  IndirOpnd *arrayHeadPtrOpnd;
  RegOpnd *indexOpnd;
  LabelInstr *zeroArgsLabel;
  IndirOpnd *arrayLengthPtrOpnd;
  RegOpnd *argsLengthOpnd;
  Instr *startCallInstr;
  RegOpnd *thisOpnd;
  Instr *thisInstr;
  RegOpnd *arrayOpnd;
  Opnd *arraySrcOpnd;
  StackSym *argLinkSym;
  SymOpnd *argLinkOpnd;
  Instr *spreadArrayInstr;
  Func *func;
  Instr *insertBeforeInstrForCFG;
  ushort callFlags_local;
  Instr *callInstr_local;
  Lowerer *this_local;
  
  if (callInstr->m_opcode != CallIDynamicSpread) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x54db,"(callInstr->m_opcode == Js::OpCode::CallIDynamicSpread)",
                       "callInstr->m_opcode == Js::OpCode::CallIDynamicSpread");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = callInstr->m_func;
  bVar2 = Func::IsInlinee(this_00);
  if (!bVar2) {
    pOVar5 = IR::Instr::UnlinkSrc2(callInstr);
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar5);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    bVar2 = StackSym::IsArgSlotSym(pSVar7);
    if ((!bVar2) || ((*(uint *)&pSVar7->field_0x18 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x54e9,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                         "Arg tree not single def...");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    IR::Opnd::Free(&pSVar6->super_Opnd,this->m_func);
    pIVar12 = (pSVar7->field_5).m_instrDef;
    if (pIVar12->m_opcode != ArgOut_A_SpreadArg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x54ed,"(spreadArrayInstr->m_opcode == Js::OpCode::ArgOut_A_SpreadArg)",
                         "spreadArrayInstr->m_opcode == Js::OpCode::ArgOut_A_SpreadArg");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pOVar5 = IR::Instr::UnlinkSrc1(pIVar12);
    pRVar8 = GetRegOpnd(this,pOVar5,pIVar12,this_00,TyUint64);
    pOVar5 = IR::Instr::UnlinkSrc2(pIVar12);
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar5);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    bVar2 = StackSym::IsArgSlotSym(pSVar7);
    if ((!bVar2) || ((*(uint *)&pSVar7->field_0x18 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x54f6,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                         "Arg tree not single def...");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    IR::Opnd::Free(&pSVar6->super_Opnd,this->m_func);
    this_01 = (pSVar7->field_5).m_instrDef;
    pOVar5 = IR::Instr::UnlinkSrc2(this_01);
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar5);
    pSVar7 = Sym::AsStackSym(&pRVar9->m_sym->super_Sym);
    IR::Instr::Unlink(this_01);
    IR::Instr::FreeDst(this_01);
    IR::Instr::Unlink(pIVar12);
    IR::Instr::FreeDst(pIVar12);
    pIVar12 = (pSVar7->field_5).m_instrDef;
    if (pIVar12->m_opcode != StartCall) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5504,"(startCallInstr->m_opcode == Js::OpCode::StartCall)",
                         "startCallInstr->m_opcode == Js::OpCode::StartCall");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    insertBeforeInstrForCFG_00 = IR::Instr::GetNextRealInstr(pIVar12);
    IR::Instr::Remove(pIVar12);
    pRVar9 = IR::RegOpnd::New(TyUint32,this_00);
    uVar3 = Js::ArrayObject::GetOffsetOfLength();
    pIVar10 = IR::IndirOpnd::New(pRVar8,uVar3,TyUint32,this_00,false);
    InsertMove(&pRVar9->super_Opnd,&pIVar10->super_Opnd,callInstr,true);
    target = IR::LabelInstr::New(Label,this_00,false);
    pIVar11 = IR::IntConstOpnd::New(0,TyInt8,this_00,false);
    InsertCompareBranch(this,&pRVar9->super_Opnd,&pIVar11->super_Opnd,BrEq_A,true,target,callInstr,
                        false);
    indexOpnd_00 = IR::RegOpnd::New(TyUint32,this_00);
    InsertMove(&indexOpnd_00->super_Opnd,&pRVar9->super_Opnd,callInstr,true);
    uVar3 = Js::JavascriptArray::GetOffsetOfHead();
    pIVar10 = IR::IndirOpnd::New(pRVar8,uVar3,TyUint64,this_00,false);
    pRVar8 = IR::RegOpnd::New(TyUint64,this_00);
    pIVar11 = IR::IntConstOpnd::New(0x18,TyUint8,this_00,false);
    InsertAdd(false,&pRVar8->super_Opnd,&pIVar10->super_Opnd,&pIVar11->super_Opnd,callInstr);
    LowererMD::LowerInlineSpreadArgOutLoop(&this->m_lowererMD,callInstr,indexOpnd_00,pRVar8);
    IR::Instr::InsertBefore(callInstr,&target->super_Instr);
    callInstr->m_opcode = CallIDynamic;
    pIVar12 = LowererMD::LowerCallIDynamic
                        (&this->m_lowererMD,callInstr,this_01,&pRVar9->super_Opnd,callFlags,
                         insertBeforeInstrForCFG_00);
    return pIVar12;
  }
  this_02 = (RejitException *)__cxa_allocate_exception(1);
  Js::RejitException::RejitException(this_02,InlineSpreadDisabled);
  __cxa_throw(this_02,&Js::RejitException::typeinfo,0);
}

Assistant:

IR::Instr *
Lowerer::LowerCallIDynamicSpread(IR::Instr *callInstr, ushort callFlags)
{
    Assert(callInstr->m_opcode == Js::OpCode::CallIDynamicSpread);

    IR::Instr * insertBeforeInstrForCFG = nullptr;

    Func *const func = callInstr->m_func;

    if (func->IsInlinee())
    {
        throw Js::RejitException(RejitReason::InlineSpreadDisabled);
    }

    IR::Instr *spreadArrayInstr = callInstr;
    IR::SymOpnd    *argLinkOpnd = spreadArrayInstr->UnlinkSrc2()->AsSymOpnd();
    StackSym       *argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);
    spreadArrayInstr = argLinkSym->m_instrDef;

    Assert(spreadArrayInstr->m_opcode == Js::OpCode::ArgOut_A_SpreadArg);

    IR::Opnd *arraySrcOpnd = spreadArrayInstr->UnlinkSrc1();
    IR::RegOpnd *arrayOpnd = GetRegOpnd(arraySrcOpnd, spreadArrayInstr, func, TyMachPtr);

    argLinkOpnd = spreadArrayInstr->UnlinkSrc2()->AsSymOpnd();

    // Walk the arg chain and find the start call
    argLinkSym = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);

    // Nothing to be done for the function object, emit as normal
    IR::Instr *thisInstr = argLinkSym->m_instrDef;
    IR::RegOpnd *thisOpnd = thisInstr->UnlinkSrc2()->AsRegOpnd();
    argLinkSym = thisOpnd->m_sym->AsStackSym();
    thisInstr->Unlink();
    thisInstr->FreeDst();

    // Remove the array ArgOut instr and StartCall, they are no longer needed
    spreadArrayInstr->Unlink();
    spreadArrayInstr->FreeDst();
    IR::Instr *startCallInstr = argLinkSym->m_instrDef;
    Assert(startCallInstr->m_opcode == Js::OpCode::StartCall);
    insertBeforeInstrForCFG = startCallInstr->GetNextRealInstr();
    startCallInstr->Remove();

    IR::RegOpnd *argsLengthOpnd = IR::RegOpnd::New(TyUint32, func);
    IR::IndirOpnd *arrayLengthPtrOpnd = IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfLength(), TyUint32, func);
    Lowerer::InsertMove(argsLengthOpnd, arrayLengthPtrOpnd, callInstr);

    // Don't bother expanding args if there are zero
    IR::LabelInstr *zeroArgsLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertCompareBranch(argsLengthOpnd, IR::IntConstOpnd::New(0, TyInt8, func), Js::OpCode::BrEq_A, true, zeroArgsLabel, callInstr);

    IR::RegOpnd *indexOpnd = IR::RegOpnd::New(TyUint32, func);
    Lowerer::InsertMove(indexOpnd, argsLengthOpnd, callInstr);

    // Get the array head offset and length
    IR::IndirOpnd *arrayHeadPtrOpnd = IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfHead(), TyMachPtr, func);
    IR::RegOpnd *arrayElementsStartOpnd = IR::RegOpnd::New(TyMachPtr, func);
    InsertAdd(false, arrayElementsStartOpnd, arrayHeadPtrOpnd, IR::IntConstOpnd::New(offsetof(Js::SparseArraySegment<Js::Var>, elements), TyUint8, func), callInstr);

    this->m_lowererMD.LowerInlineSpreadArgOutLoop(callInstr, indexOpnd, arrayElementsStartOpnd);

    // Resume if we have zero args
    callInstr->InsertBefore(zeroArgsLabel);

    // Lower call
    callInstr->m_opcode = Js::OpCode::CallIDynamic;
    callInstr = m_lowererMD.LowerCallIDynamic(callInstr, thisInstr, argsLengthOpnd, callFlags, insertBeforeInstrForCFG);

    return callInstr;
}